

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3DLoader.h
# Opt level: O3

void __thiscall Assimp::Q3DImporter::Face::Face(Face *this,uint s)

{
  allocator_type local_12;
  allocator_type local_11;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->indices,(ulong)s,&local_11);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->uvindices,(ulong)s,&local_12);
  this->mat = 0;
  return;
}

Assistant:

explicit Face(unsigned int s)
            :   indices   (s)
            ,   uvindices (s)
            ,   mat       (0)
        {
        }